

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CustomMessageOperator::process
          (CustomMessageOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _Head_base<0UL,_helics::Message_*,_false> *in_RDX;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_10;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0) {
    (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)in_RDX->_M_head_impl;
    in_RDX->_M_head_impl = (Message *)0x0;
  }
  else {
    local_10._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)in_RDX->_M_head_impl;
    in_RDX->_M_head_impl = (Message *)0x0;
    std::
    function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
    ::operator()((function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                  *)this,message + 1);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_10);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> CustomMessageOperator::process(std::unique_ptr<Message> message)
{
    if (messageFunction) {
        return messageFunction(std::move(message));
    }
    return message;
}